

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapCore.c
# Opt level: O2

void Amap_ManSetDefaultParams(Amap_Par_t *p)

{
  p->nIterFlow = 1;
  p->nIterArea = 4;
  p->nCutsMax = 500;
  p->fUseMuxes = 0;
  p->fUseXors = 1;
  p->fFreeInvs = 0;
  p->fEpsilon = 0.001;
  p->fADratio = 0.0;
  p->fVerbose = 0;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [This procedure sets default parameters.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Amap_ManSetDefaultParams( Amap_Par_t * p )
{
    memset( p, 0, sizeof(Amap_Par_t) );
    p->nIterFlow = 1;            // iterations of area flow
    p->nIterArea = 4;            // iteratoins of exact area
    p->nCutsMax  = 500;          // the maximum number of cuts at a node
    p->fUseMuxes = 0;            // enables the use of MUXes
    p->fUseXors  = 1;            // enables the use of XORs
    p->fFreeInvs = 0;            // assume inverters are free (area = 0)
    p->fEpsilon  = (float)0.001; // used to compare floating point numbers
    p->fVerbose  = 0;            // verbosity flag
}